

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestinitiatorFixtureSendMessage_NotLoggedInAndResetOnLogonTrue_MessageNotSent::
TestinitiatorFixtureSendMessage_NotLoggedInAndResetOnLogonTrue_MessageNotSent
          (TestinitiatorFixtureSendMessage_NotLoggedInAndResetOnLogonTrue_MessageNotSent *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"SendMessage_NotLoggedInAndResetOnLogonTrue_MessageNotSent",
             "SessionTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionTestCase.cpp"
             ,0x8cf);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00320710;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, SendMessage_NotLoggedInAndResetOnLogonTrue_MessageNotSent) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  createSession(1, 0, 31);

  object->setResetOnLogon(true);

  FIX::Message neworder1 = createNewOrderSingle("ISLD", "TW", 1);
  CHECK(!object->send(neworder1));
}